

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O2

ostream * operator<<(ostream *str,ArchiveEntry *data)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(str,(string *)data);
  std::operator<<(poVar1,",");
  poVar1 = std::operator<<(str,(string *)&data->RunName);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(str,0));
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<long>((long)str);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(data->ExperimentValueScale);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(data->AverageBaseline);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(data->MinBaseline);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
  std::operator<<(poVar1,",");
  operator<<(str,&data->MinStats);
  std::operator<<(str,",");
  poVar1 = std::ostream::_M_insert<double>(data->MaxBaseline);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
  std::operator<<(poVar1,",");
  operator<<(str,&data->MaxStats);
  std::operator<<(str,",");
  poVar1 = std::ostream::_M_insert<double>(data->CurrentBaseline);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
  std::operator<<(poVar1,",");
  operator<<(str,&data->CurrentStats);
  std::endl<char,std::char_traits<char>>(str);
  return str;
}

Assistant:

std::ostream& operator<<(std::ostream& str, ArchiveEntry const& data)
{
	str << data.GroupName << ",";
	str << data.RunName << ",";
	str << data.Failure << ",";
	str << data.ExperimentValue << ",";
	str << data.ExperimentValueScale << ",";
	str << data.FirstRanDate << ",";
	str << data.TotalSamplesCollected << ",";
	str << data.AverageBaseline << ",";
	str << data.MinBaseline << ",";
	str << data.MinBaseline_TimeSinceEpoch << ",";
	str << data.MinStats << ",";
	str << data.MaxBaseline << ",";
	str << data.MaxBaseline_TimeSinceEpoch << ",";
	str << data.MaxStats << ",";
	str << data.CurrentBaseline << ",";
	str << data.CurrentBaseline_TimeSinceEpoch << ",";
	str << data.CurrentStats << std::endl;
	return str;
}